

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O0

void encode_symbol(lzma_coder_conflict9 *coder,lzma_mf *mf,uint32_t back,uint32_t len,
                  uint32_t position)

{
  uint pos_state_00;
  uint32_t pos_state;
  uint32_t position_local;
  uint32_t len_local;
  uint32_t back_local;
  lzma_mf *mf_local;
  lzma_coder_conflict9 *coder_local;
  
  pos_state_00 = position & coder->pos_mask;
  if (back == 0xffffffff) {
    if (len != 1) {
      __assert_fail("len == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                    ,0xfa,
                    "void encode_symbol(lzma_coder *, lzma_mf *, uint32_t, uint32_t, uint32_t)");
    }
    rc_bit(&coder->rc,coder->is_match[coder->state] + pos_state_00,0);
    literal(coder,mf,position);
  }
  else {
    rc_bit(&coder->rc,coder->is_match[coder->state] + pos_state_00,1);
    if (back < 4) {
      rc_bit(&coder->rc,coder->is_rep + coder->state,1);
      rep_match(coder,pos_state_00,back,len);
    }
    else {
      rc_bit(&coder->rc,coder->is_rep + coder->state,0);
      match(coder,pos_state_00,back - 4,len);
    }
  }
  if (mf->read_ahead < len) {
    __assert_fail("mf->read_ahead >= len",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                  ,0x10f,"void encode_symbol(lzma_coder *, lzma_mf *, uint32_t, uint32_t, uint32_t)"
                 );
  }
  mf->read_ahead = mf->read_ahead - len;
  return;
}

Assistant:

static void
encode_symbol(lzma_coder *coder, lzma_mf *mf,
		uint32_t back, uint32_t len, uint32_t position)
{
	const uint32_t pos_state = position & coder->pos_mask;

	if (back == UINT32_MAX) {
		// Literal i.e. eight-bit byte
		assert(len == 1);
		rc_bit(&coder->rc,
				&coder->is_match[coder->state][pos_state], 0);
		literal(coder, mf, position);
	} else {
		// Some type of match
		rc_bit(&coder->rc,
			&coder->is_match[coder->state][pos_state], 1);

		if (back < REP_DISTANCES) {
			// It's a repeated match i.e. the same distance
			// has been used earlier.
			rc_bit(&coder->rc, &coder->is_rep[coder->state], 1);
			rep_match(coder, pos_state, back, len);
		} else {
			// Normal match
			rc_bit(&coder->rc, &coder->is_rep[coder->state], 0);
			match(coder, pos_state, back - REP_DISTANCES, len);
		}
	}

	assert(mf->read_ahead >= len);
	mf->read_ahead -= len;
}